

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_mustache(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,string_type *input,
              context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *ctx)

{
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_21;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcStack_20;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> parser;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_local;
  string_type *input_local;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  pcStack_20 = ctx;
  basic_mustache(this);
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::parser
            (&local_21,input,pcStack_20,&this->root_component_,&this->error_message_);
  return;
}

Assistant:

basic_mustache(const string_type& input, context_internal<string_type>& ctx)
        : basic_mustache() {
        parser<string_type> parser{input, ctx, root_component_, error_message_};
    }